

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BringWindowToDisplayBehind(ImGuiWindow *window,ImGuiWindow *behind_window)

{
  ImGuiWindow *window_00;
  ImGuiWindow *window_01;
  ImGuiContext *pIVar1;
  uint uVar2;
  uint uVar3;
  ImGuiWindow **ppIVar4;
  
  pIVar1 = GImGui;
  if ((window == (ImGuiWindow *)0x0) || (behind_window == (ImGuiWindow *)0x0)) {
    __assert_fail("window != __null && behind_window != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1a72,"void ImGui::BringWindowToDisplayBehind(ImGuiWindow *, ImGuiWindow *)");
  }
  window_00 = window->RootWindow;
  window_01 = behind_window->RootWindow;
  uVar2 = FindWindowDisplayIndex(window_00);
  uVar3 = FindWindowDisplayIndex(window_01);
  if ((int)uVar2 < (int)uVar3) {
    ppIVar4 = (pIVar1->Windows).Data;
    memmove(ppIVar4 + (int)uVar2,ppIVar4 + (long)(int)uVar2 + 1,(long)(int)(~uVar2 + uVar3) << 3);
    if (((int)uVar3 < 1) || ((pIVar1->Windows).Size < (int)uVar3)) {
LAB_0013c81b:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                    ,0x703,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
    }
    ppIVar4 = (pIVar1->Windows).Data + ((ulong)uVar3 - 1);
  }
  else {
    ppIVar4 = (pIVar1->Windows).Data;
    memmove(ppIVar4 + (long)(int)uVar3 + 1,ppIVar4 + (int)uVar3,(long)(int)(uVar2 - uVar3) << 3);
    if (((int)uVar3 < 0) || ((pIVar1->Windows).Size <= (int)uVar3)) goto LAB_0013c81b;
    ppIVar4 = (pIVar1->Windows).Data + uVar3;
  }
  *ppIVar4 = window_00;
  return;
}

Assistant:

void ImGui::BringWindowToDisplayBehind(ImGuiWindow* window, ImGuiWindow* behind_window)
{
    IM_ASSERT(window != NULL && behind_window != NULL);
    ImGuiContext& g = *GImGui;
    window = window->RootWindow;
    behind_window = behind_window->RootWindow;
    int pos_wnd = FindWindowDisplayIndex(window);
    int pos_beh = FindWindowDisplayIndex(behind_window);
    if (pos_wnd < pos_beh)
    {
        size_t copy_bytes = (pos_beh - pos_wnd - 1) * sizeof(ImGuiWindow*);
        memmove(&g.Windows.Data[pos_wnd], &g.Windows.Data[pos_wnd + 1], copy_bytes);
        g.Windows[pos_beh - 1] = window;
    }
    else
    {
        size_t copy_bytes = (pos_wnd - pos_beh) * sizeof(ImGuiWindow*);
        memmove(&g.Windows.Data[pos_beh + 1], &g.Windows.Data[pos_beh], copy_bytes);
        g.Windows[pos_beh] = window;
    }
}